

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::_next_node(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  csubstr str;
  bool bVar1;
  error_flags eVar2;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  csubstr p;
  char msg_4 [44];
  size_t idx;
  char msg_3 [75];
  char msg_2 [40];
  char msg_1 [35];
  char msg [46];
  csubstr prev;
  size_t node;
  _lookup_path_token token;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  char *in_stack_fffffffffffffba8;
  Location *in_stack_fffffffffffffbb0;
  ulong local_438;
  size_t in_stack_fffffffffffffbd8;
  undefined1 *puVar3;
  Tree *in_stack_fffffffffffffbe0;
  code *pcVar4;
  size_t in_stack_fffffffffffffc28;
  size_t in_stack_fffffffffffffc30;
  Tree *in_stack_fffffffffffffc38;
  basic_substring<const_char> local_3b0;
  char *local_3a0;
  undefined4 local_398;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  char *in_stack_fffffffffffffc90;
  undefined1 local_368 [48];
  char *local_338;
  size_t local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  basic_substring<const_char> local_310;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  char *local_2e0;
  undefined1 local_2d8 [56];
  csubstr *in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  Tree *in_stack_fffffffffffffd70;
  undefined4 uStack_268;
  undefined4 uStack_264;
  char *local_260;
  undefined1 local_258 [40];
  csubstr local_230 [2];
  undefined4 uStack_208;
  undefined4 uStack_204;
  char *local_200;
  undefined1 local_1f8 [48];
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  char *local_1b0;
  undefined1 local_1a8 [48];
  _lookup_path_token *in_stack_fffffffffffffe88;
  lookup_result *in_stack_fffffffffffffe90;
  size_t sVar5;
  Tree *in_stack_fffffffffffffe98;
  size_t sVar6;
  _lookup_path_token local_160;
  undefined8 *local_148;
  long local_140;
  size_t local_130;
  csubstr *local_128;
  char *local_120;
  undefined4 local_118;
  ulong local_110;
  long local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  undefined4 local_e8;
  char *local_e0;
  undefined4 local_d8;
  char *local_d0;
  undefined4 local_c8;
  ulong local_c0;
  ulong local_b8;
  _lookup_path_token *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  NodeType *local_90;
  undefined8 local_88;
  NodeType *local_80;
  undefined8 local_78;
  NodeType *local_70;
  undefined8 local_68;
  NodeType *local_60;
  undefined8 local_58;
  NodeData *local_48;
  undefined8 local_40;
  NodeData *local_30;
  char *local_28;
  size_t local_20;
  undefined8 *local_18;
  char *local_10;
  size_t local_8;
  
  local_148 = in_RDX;
  local_140 = in_RSI;
  _next_token(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  bVar1 = _lookup_path_token::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    return 0xffffffffffffffff;
  }
  sVar6 = 0xffffffffffffffff;
  local_60 = &local_160.type;
  local_68 = 4;
  sVar5 = local_160.value.len;
  if (local_160.type.type != MAP) {
    local_70 = &local_160.type;
    local_78 = 8;
    if (local_160.type.type != SEQ) {
      local_80 = &local_160.type;
      local_88 = 3;
      if (local_160.type.type == KEYVAL) {
        local_230[0] = lookup_result::unresolved
                                 ((lookup_result *)
                                  CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        local_128 = local_230;
        bVar1 = true;
        if (local_230[0].len != 0) {
          bVar1 = local_230[0].str == (char *)0x0;
        }
        if (!bVar1) {
          memcpy(local_258,"check failed: (r->unresolved().empty())",0x28);
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          pcVar4 = *(code **)(in_RDI + 0x58);
          Location::Location(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          (*pcVar4)(local_258,0x28,*(undefined8 *)(in_RDI + 0x40));
          in_stack_fffffffffffffba0 = uStack_268;
          in_stack_fffffffffffffba4 = uStack_264;
          in_stack_fffffffffffffba8 = local_260;
        }
        local_58 = *(undefined8 *)(local_140 + 8);
        local_48 = _p(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        if (((local_48->m_type).type & MAP) != NOTYPE) {
          sVar6 = find_child(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                             in_stack_fffffffffffffd60);
        }
      }
      else {
        local_90 = &local_160.type;
        local_98 = 2;
        if (local_160.type.type == KEY) {
          bVar1 = basic_substring<const_char>::begins_with(&local_160.value,'[');
          if ((!bVar1) ||
             (bVar1 = basic_substring<const_char>::ends_with(&local_160.value,']'), !bVar1)) {
            memcpy(local_2d8,
                   "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))",
                   0x4b);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar4 = *(code **)(in_RDI + 0x58);
            Location::Location(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            (*pcVar4)(local_2d8,0x4b,*(undefined8 *)(in_RDI + 0x40));
            in_stack_fffffffffffffb90 = uStack_2f8;
            in_stack_fffffffffffffb94 = uStack_2f4;
            in_stack_fffffffffffffb98 = local_2f0;
            in_stack_fffffffffffffb9c = uStack_2ec;
            in_stack_fffffffffffffba0 = uStack_2e8;
            in_stack_fffffffffffffba4 = uStack_2e4;
            in_stack_fffffffffffffba8 = local_2e0;
          }
          local_b0 = &local_160;
          local_b8 = 1;
          local_c0 = 1;
          if (local_160.value.len == 0) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_c8 = 0x1560;
            handle_error(0x347f4b,(char *)0x1560,"check failed: %s","left >= 0 && left <= len");
          }
          if (local_160.value.len < local_c0) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_e0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_d8 = 0x1561;
            handle_error(0x347f4b,(char *)0x1561,"check failed: %s","right >= 0 && right <= len");
          }
          if ((local_160.value.len - local_c0) + 1 < local_b8) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_e8 = 0x1562;
            handle_error(0x347f4b,(char *)0x1562,"check failed: %s","left <= len - right + 1");
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffba8,
                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
          local_320 = local_a8;
          local_318 = local_a0;
          local_310 = basic_substring<const_char>::trim
                                ((basic_substring<const_char> *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 (char)((uint)in_stack_fffffffffffffb9c >> 0x18));
          local_160.value.str = local_310.str;
          local_160.value.len = local_310.len;
          local_328 = 0;
          local_338 = local_310.str;
          local_330 = local_310.len;
          local_10 = local_310.str;
          local_8 = local_310.len;
          local_18 = &local_328;
          local_28 = local_310.str;
          local_20 = local_310.len;
          str.str._4_4_ = in_stack_fffffffffffffc8c;
          str.str._0_4_ = in_stack_fffffffffffffc88;
          str.len = (size_t)in_stack_fffffffffffffc90;
          bVar1 = atou<unsigned_long>(str,(unsigned_long *)
                                          CONCAT44(in_stack_fffffffffffffc84,
                                                   in_stack_fffffffffffffc80));
          if (!bVar1) {
            memcpy(local_368,"check failed: from_chars(token.value, &idx)",0x2c);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar4 = *(code **)(in_RDI + 0x58);
            puVar3 = local_368;
            sVar6 = CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0);
            in_stack_fffffffffffffba0 = in_stack_fffffffffffffc88;
            in_stack_fffffffffffffba4 = in_stack_fffffffffffffc8c;
            Location::Location(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,sVar6,
                               CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            in_stack_fffffffffffffba8 = in_stack_fffffffffffffc90;
            (*pcVar4)(puVar3,0x2c,*(undefined8 *)(in_RDI + 0x40));
          }
          sVar6 = child(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                        in_stack_fffffffffffffc28);
        }
        else {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_3a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_398 = 0x6928;
          handle_error(0x347f4b,(char *)0x6928,"never reach this point");
        }
      }
      goto LAB_002f01fc;
    }
  }
  bVar1 = basic_substring<const_char>::begins_with(&local_160.value,'[');
  if (bVar1) {
    memcpy(local_1a8,"check failed: (!token.value.begins_with(\'[\'))",0x2e);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    pcVar4 = *(code **)(in_RDI + 0x58);
    puVar3 = local_1a8;
    Location::Location(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    (*pcVar4)(puVar3,0x2e,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffb90 = uStack_1c8;
    in_stack_fffffffffffffb94 = uStack_1c4;
    in_stack_fffffffffffffb98 = local_1c0;
    in_stack_fffffffffffffb9c = uStack_1bc;
    in_stack_fffffffffffffba0 = uStack_1b8;
    in_stack_fffffffffffffba4 = uStack_1b4;
    in_stack_fffffffffffffba8 = local_1b0;
  }
  local_40 = *(undefined8 *)(local_140 + 8);
  local_30 = _p(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  if (((local_30->m_type).type & MAP) == NOTYPE) {
    memcpy(local_1f8,"check failed: (is_map(r->closest))",0x23);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    pcVar4 = *(code **)(in_RDI + 0x58);
    puVar3 = local_1f8;
    Location::Location(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                       CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    (*pcVar4)(puVar3,0x23,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffba0 = uStack_208;
    in_stack_fffffffffffffba4 = uStack_204;
    in_stack_fffffffffffffba8 = local_200;
  }
  sVar6 = find_child(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
LAB_002f01fc:
  if (sVar6 == 0xffffffffffffffff) {
    local_108 = local_140 + 0x18;
    if (*(long *)(local_140 + 0x10) == 0) {
      local_438 = *(ulong *)(local_140 + 0x10);
    }
    else {
      local_438 = *(long *)(local_140 + 0x10) - 1;
    }
    local_110 = local_438;
    if (*(ulong *)(local_140 + 0x20) < local_438) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x1533;
      handle_error(0x347f4b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    local_3b0.str = local_100;
    local_3b0.len = local_f8;
    *(size_t *)(local_140 + 0x10) = *(long *)(local_140 + 0x10) - sVar5;
    bVar1 = basic_substring<const_char>::begins_with(&local_3b0,'.');
    local_130 = sVar6;
    if (bVar1) {
      *(long *)(local_140 + 0x10) = *(long *)(local_140 + 0x10) + -1;
    }
  }
  else {
    *local_148 = local_160.value.str;
    local_148[1] = local_160.value.len;
    local_148[2] = local_160.type.type;
    local_130 = sVar6;
  }
  return local_130;
}

Assistant:

size_t Tree::_next_node(lookup_result * r, _lookup_path_token *parent) const
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    csubstr prev = token.value;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
        node = find_child(r->closest, token.value);
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
            node = find_child(r->closest, token.value);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx = 0;
        _RYML_CB_CHECK(m_callbacks, from_chars(token.value, &idx));
        node = child(r->closest, idx);
    }
    else
    {
        C4_NEVER_REACH();
    }

    if(node != NONE)
    {
        *parent = token;
    }
    else
    {
        csubstr p = r->path.sub(r->path_pos > 0 ? r->path_pos - 1 : r->path_pos);
        r->path_pos -= prev.len;
        if(p.begins_with('.'))
            r->path_pos -= 1u;
    }

    return node;
}